

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.cpp
# Opt level: O0

void begin_end(void)

{
  mapped_type *pmVar1;
  iterator ppVar2;
  difference_type dVar3;
  pair<char,_int> *local_70;
  iterator it;
  pair<char,_int> results [3];
  key_type local_46 [19];
  key_type local_33;
  allocator local_32;
  key_compare local_31;
  undefined1 local_30 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> mymap;
  
  eastl::allocator::allocator(&local_32,"EASTL vector");
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,&local_31,
             &local_32);
  local_33 = 'b';
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &local_33);
  *pmVar1 = 100;
  local_46[1] = 0x61;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_46 + 1);
  *pmVar1 = 200;
  local_46[0] = 'c';
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_46);
  *pmVar1 = 300;
  eastl::make_pair<char,int>('a',200);
  results[0] = eastl::make_pair<char,int>('b',100);
  results[1] = eastl::make_pair<char,int>('c',300);
  local_70 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
  while( true ) {
    ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::end
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    if (local_70 == ppVar2) {
      eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
                ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
      return;
    }
    ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    dVar3 = eastl::distance<eastl::pair<char,int>*>(ppVar2,local_70);
    if (results[dVar3 + -1].first != local_70->first) break;
    ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    dVar3 = eastl::distance<eastl::pair<char,int>*>(ppVar2,local_70);
    if (results[dVar3 + -1].second != local_70->second) {
      __assert_fail("results[eastl::distance(mymap.begin(), it)].second == it->second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                    ,0x46,"void begin_end()");
    }
    local_70 = local_70 + 1;
  }
  __assert_fail("results[eastl::distance(mymap.begin(), it)].first == it->first",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                ,0x45,"void begin_end()");
}

Assistant:

static void begin_end() {
  eastl::vector_map<char, int> mymap;

  mymap['b'] = 100;
  mymap['a'] = 200;
  mymap['c'] = 300;

  eastl::pair<char, int> const results[] = {
    eastl::make_pair('a', 200),
    eastl::make_pair('b', 100),
    eastl::make_pair('c', 300),
  };
  // show content:
  for (eastl::vector_map<char, int>::iterator it=mymap.begin(); it != mymap.end(); ++it ) {
    assert(results[eastl::distance(mymap.begin(), it)].first == it->first);
    assert(results[eastl::distance(mymap.begin(), it)].second == it->second);
  }
}